

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResultCollector.cpp
# Opt level: O3

void __thiscall CppUnit::TestResultCollector::freeFailures(TestResultCollector *this)

{
  _Elt_pointer ppTVar1;
  _Elt_pointer ppTVar2;
  _Elt_pointer ppTVar3;
  _Map_pointer pppTVar4;
  _Elt_pointer ppTVar5;
  
  ppTVar2 = (this->m_failures).
            super__Deque_base<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  ppTVar1 = (this->m_failures).
            super__Deque_base<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppTVar2 != ppTVar1) {
    ppTVar5 = (this->m_failures).
              super__Deque_base<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_last;
    pppTVar4 = (this->m_failures).
               super__Deque_base<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      ppTVar3 = ppTVar2 + 1;
      if (ppTVar3 == ppTVar5) {
        ppTVar3 = pppTVar4[1];
        pppTVar4 = pppTVar4 + 1;
        ppTVar5 = ppTVar3 + 0x40;
      }
      if (*ppTVar2 != (TestFailure *)0x0) {
        (*(*ppTVar2)->_vptr_TestFailure[1])();
        ppTVar1 = (this->m_failures).
                  super__Deque_base<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      }
      ppTVar2 = ppTVar3;
    } while (ppTVar3 != ppTVar1);
  }
  std::deque<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>::clear
            (&this->m_failures);
  return;
}

Assistant:

void 
TestResultCollector::freeFailures()
{
  TestFailures::iterator itFailure = m_failures.begin();
  while ( itFailure != m_failures.end() )
    delete *itFailure++;
  m_failures.clear();
}